

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBorderClampSamplerParameterIWithWrongPname.cpp
# Opt level: O1

void __thiscall
glcts::TextureBorderClampSamplerParameterIWithWrongPnameTest::VerifyGLSamplerParameterIiv
          (TextureBorderClampSamplerParameterIWithWrongPnameTest *this,GLuint sampler_id,
          GLenum pname,GLenum expected_error)

{
  int iVar1;
  GLenum GVar2;
  undefined4 extraout_var;
  undefined8 *puVar3;
  char *__s;
  size_t sVar4;
  value_type_conflict1 *__val;
  Enum<int,_2UL> local_1d0;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  ios_base local_138 [264];
  
  iVar1 = (*((this->super_TextureBorderClampBase).super_TestCaseBase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  puVar3 = (undefined8 *)operator_new(0x80);
  *puVar3 = 0;
  puVar3[1] = 0;
  puVar3[2] = 0;
  puVar3[3] = 0;
  puVar3[4] = 0;
  puVar3[5] = 0;
  puVar3[6] = 0;
  puVar3[7] = 0;
  puVar3[8] = 0;
  puVar3[9] = 0;
  puVar3[10] = 0;
  puVar3[0xb] = 0;
  puVar3[0xc] = 0;
  puVar3[0xd] = 0;
  puVar3[0xe] = 0;
  puVar3[0xf] = 0;
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x1260))(sampler_id,pname,puVar3);
  GVar2 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  if (GVar2 != expected_error) {
    this->m_test_passed = '\0';
    local_1b0 = (undefined1  [8])
                ((this->super_TextureBorderClampBase).super_TestCaseBase.super_TestCase.
                 super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"glSamplerParameterIivEXT() failed:[",0x23);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"sampler id:",0xb);
    std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", pname:",8);
    __s = TextureBorderClampBase::getPNameString(&this->super_TextureBorderClampBase,pname);
    if (__s == (char *)0x0) {
      std::ios::clear((int)(ostringstream *)&local_1a8 + (int)local_1a8[-3]);
    }
    else {
      sVar4 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,__s,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"] reported error code:[",0x17);
    local_1c0.m_getName = glu::getErrorName;
    local_1c0.m_value = GVar2;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"] expected error code:[",0x17);
    local_1d0.m_getName = glu::getErrorName;
    local_1d0.m_value = expected_error;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1d0,(ostream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"]\n",2);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  operator_delete(puVar3,0x80);
  return;
}

Assistant:

void TextureBorderClampSamplerParameterIWithWrongPnameTest::VerifyGLSamplerParameterIiv(glw::GLuint sampler_id,
																						glw::GLenum pname,
																						glw::GLenum expected_error)
{
	glw::GLenum				error_code = GL_NO_ERROR;
	const glw::Functions&   gl		   = m_context.getRenderContext().getFunctions();
	std::vector<glw::GLint> params(m_buffer_size);

	gl.samplerParameterIiv(sampler_id, pname, &params[0]);

	error_code = gl.getError();
	if (expected_error != error_code)
	{
		m_test_passed = false;

		m_testCtx.getLog() << tcu::TestLog::Message << "glSamplerParameterIivEXT() failed:["
						   << "sampler id:" << sampler_id << ", pname:" << getPNameString(pname)
						   << "] reported error code:[" << glu::getErrorStr(error_code) << "] expected error code:["
						   << glu::getErrorStr(expected_error) << "]\n"
						   << tcu::TestLog::EndMessage;
	}
}